

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportProperty.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::FBXExportProperty::FBXExportProperty(FBXExportProperty *this,aiMatrix4x4 *vm)

{
  float *pfVar1;
  uint c;
  long lVar2;
  uint r;
  long lVar3;
  pointer puVar4;
  allocator_type local_21;
  
  this->type = 'd';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data,0x80,&local_21);
  puVar4 = (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      pfVar1 = aiMatrix4x4t<float>::operator[](vm,(uint)lVar3);
      *(double *)(puVar4 + lVar3 * 8) = (double)pfVar1[lVar2];
    }
    puVar4 = puVar4 + 0x20;
  }
  return;
}

Assistant:

FBXExportProperty::FBXExportProperty(const aiMatrix4x4& vm)
: type('d')
, data(8 * 16) {
    double* d = reinterpret_cast<double*>(data.data());
    for (unsigned int c = 0; c < 4; ++c) {
        for (unsigned int r = 0; r < 4; ++r) {
            d[4 * c + r] = vm[r][c];
        }
    }
}